

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O3

int __thiscall anon_unknown.dwarf_254152::AlsaPlayback::mixerProc(AlsaPlayback *this)

{
  uint uVar1;
  ALCdevice *pAVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uVar8;
  char *__format;
  FILE *__stream;
  long lVar9;
  snd_pcm_uframes_t frames;
  snd_pcm_uframes_t offset;
  snd_pcm_channel_area_t *areas;
  long local_58;
  pthread_mutex_t *local_50;
  long local_48;
  ulong local_40;
  long *local_38;
  
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  uVar3 = BytesFromDevFmt(((this->super_BackendBase).mDevice)->FmtType);
  pAVar2 = (this->super_BackendBase).mDevice;
  local_40 = (ulong)pAVar2->UpdateSize;
  uVar1 = pAVar2->BufferSize;
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    local_50 = (pthread_mutex_t *)&this->mMutex;
    do {
      iVar4 = verify_state(this->mPcmHandle);
      if (iVar4 < 0) {
        if (0 < (int)gLogLevel) {
          _GLOBAL__N_1::AlsaPlayback::mixerProc();
        }
        pAVar2 = (this->super_BackendBase).mDevice;
        uVar8 = (*(anonymous_namespace)::psnd_strerror)(iVar4);
        ALCdevice::handleDisconnect(pAVar2,"Bad state: %s",uVar8);
        return 0;
      }
      uVar6 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
      if ((long)uVar6 < 0) {
        if (0 < (int)gLogLevel) {
          _GLOBAL__N_1::AlsaPlayback::mixerProc();
        }
      }
      else if (uVar1 < uVar6) {
        if (1 < (int)gLogLevel) {
          _GLOBAL__N_1::AlsaPlayback::mixerProc();
        }
        (*(anonymous_namespace)::psnd_pcm_reset)(this->mPcmHandle);
      }
      else if (uVar6 < local_40) {
        if ((iVar4 == 3) ||
           (iVar4 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle), -1 < iVar4)) {
          iVar4 = (*(anonymous_namespace)::psnd_pcm_wait)(this->mPcmHandle,1000);
          if ((iVar4 == 0) && (0 < (int)gLogLevel)) {
            _GLOBAL__N_1::AlsaPlayback::mixerProc();
          }
        }
        else if (0 < (int)gLogLevel) {
          _GLOBAL__N_1::AlsaPlayback::mixerProc();
        }
      }
      else {
        iVar4 = pthread_mutex_lock(local_50);
        if (iVar4 != 0) {
          std::__throw_system_error(iVar4);
        }
        for (lVar9 = uVar6 - uVar6 % local_40; lVar9 != 0; lVar9 = lVar9 - lVar7) {
          local_38 = (long *)0x0;
          local_48 = 0;
          local_58 = lVar9;
          iVar4 = (*(anonymous_namespace)::psnd_pcm_mmap_begin)
                            (this->mPcmHandle,&local_38,&local_48,&local_58);
          __stream = (FILE *)gLogFile;
          if (iVar4 < 0) {
            if (0 < (int)gLogLevel) {
              uVar8 = (*(anonymous_namespace)::psnd_strerror)(iVar4);
              __format = "[ALSOFT] (EE) mmap begin error: %s\n";
LAB_001622f9:
              fprintf(__stream,__format,uVar8);
            }
            break;
          }
          ALCdevice::renderSamples
                    ((this->super_BackendBase).mDevice,
                     (void *)(((ulong)*(uint *)((long)local_38 + 0xc) * local_48 >> 3) + *local_38),
                     (ALuint)local_58,(ulong)*(uint *)((long)local_38 + 0xc) / (ulong)(uVar3 << 3));
          lVar7 = (*(anonymous_namespace)::psnd_pcm_mmap_commit)(this->mPcmHandle,local_48,local_58)
          ;
          __stream = (FILE *)gLogFile;
          if ((lVar7 < 0) || (lVar7 != local_58)) {
            if (0 < (int)gLogLevel) {
              uVar5 = (undefined4)lVar7;
              if (-1 < lVar7) {
                uVar5 = 0xffffffe0;
              }
              uVar8 = (*(anonymous_namespace)::psnd_strerror)(uVar5);
              __format = "[ALSOFT] (EE) mmap commit error: %s\n";
              goto LAB_001622f9;
            }
            break;
          }
        }
        pthread_mutex_unlock(local_50);
      }
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int AlsaPlayback::mixerProc()
{
    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    const size_t samplebits{mDevice->bytesFromFmt() * 8};
    const snd_pcm_uframes_t update_size{mDevice->UpdateSize};
    const snd_pcm_uframes_t buffer_size{mDevice->BufferSize};
    while(!mKillNow.load(std::memory_order_acquire))
    {
        int state{verify_state(mPcmHandle)};
        if(state < 0)
        {
            ERR("Invalid state detected: %s\n", snd_strerror(state));
            mDevice->handleDisconnect("Bad state: %s", snd_strerror(state));
            break;
        }

        snd_pcm_sframes_t avails{snd_pcm_avail_update(mPcmHandle)};
        if(avails < 0)
        {
            ERR("available update failed: %s\n", snd_strerror(static_cast<int>(avails)));
            continue;
        }
        snd_pcm_uframes_t avail{static_cast<snd_pcm_uframes_t>(avails)};

        if(avail > buffer_size)
        {
            WARN("available samples exceeds the buffer size\n");
            snd_pcm_reset(mPcmHandle);
            continue;
        }

        // make sure there's frames to process
        if(avail < update_size)
        {
            if(state != SND_PCM_STATE_RUNNING)
            {
                int err{snd_pcm_start(mPcmHandle)};
                if(err < 0)
                {
                    ERR("start failed: %s\n", snd_strerror(err));
                    continue;
                }
            }
            if(snd_pcm_wait(mPcmHandle, 1000) == 0)
                ERR("Wait timeout... buffer size too low?\n");
            continue;
        }
        avail -= avail%update_size;

        // it is possible that contiguous areas are smaller, thus we use a loop
        std::lock_guard<std::mutex> _{mMutex};
        while(avail > 0)
        {
            snd_pcm_uframes_t frames{avail};

            const snd_pcm_channel_area_t *areas{};
            snd_pcm_uframes_t offset{};
            int err{snd_pcm_mmap_begin(mPcmHandle, &areas, &offset, &frames)};
            if(err < 0)
            {
                ERR("mmap begin error: %s\n", snd_strerror(err));
                break;
            }

            char *WritePtr{static_cast<char*>(areas->addr) + (offset * areas->step / 8)};
            mDevice->renderSamples(WritePtr, static_cast<ALuint>(frames), areas->step/samplebits);

            snd_pcm_sframes_t commitres{snd_pcm_mmap_commit(mPcmHandle, offset, frames)};
            if(commitres < 0 || static_cast<snd_pcm_uframes_t>(commitres) != frames)
            {
                ERR("mmap commit error: %s\n",
                    snd_strerror(commitres >= 0 ? -EPIPE : static_cast<int>(commitres)));
                break;
            }

            avail -= frames;
        }
    }

    return 0;
}